

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O0

void hit_bars(obj **obj_p,int objx,int objy,int barsx,int barsy,boolean your_fault,
             boolean from_invent)

{
  obj *obj;
  boolean bVar1;
  int iVar2;
  int iVar3;
  char *line;
  bool bVar4;
  int obj_type;
  obj *otmp;
  boolean your_fault_local;
  int barsy_local;
  int barsx_local;
  int objy_local;
  int objx_local;
  obj **obj_p_local;
  
  obj = *obj_p;
  iVar2 = (int)obj->otyp;
  if (your_fault == '\0') {
    iVar3 = breaks(obj,(xchar)objx,(xchar)objy);
  }
  else {
    iVar3 = hero_breaks(obj,(xchar)objx,(xchar)objy,from_invent);
  }
  if (iVar3 == 0) {
    if ((iVar2 == 0x214) || (iVar2 == 0x216)) {
      pline("Whang!");
    }
    else if (((obj->oclass == '\f') || ((*(ushort *)&objects[iVar2].field_0x11 >> 4 & 0x1f) == 0xf))
            || ((*(ushort *)&objects[iVar2].field_0x11 >> 4 & 0x1f) == 0xe)) {
      pline("Clink!");
    }
    else {
      pline("Clonk!");
    }
  }
  else {
    *obj_p = (obj *)0x0;
    if (iVar2 == 0x141) {
      if ((viz_array[barsy][barsx] & 2U) == 0) {
        bVar4 = false;
        if (u.uprops[0x23].intrinsic != 0) {
          bVar4 = true;
          if ((u.uprops[0x24].extrinsic == 0) && (bVar4 = false, u.umonnum != u.umonster)) {
            bVar1 = dmgtype(youmonst.data,0x24);
            bVar4 = bVar1 != '\0';
          }
          bVar4 = (bool)(bVar4 ^ 1);
        }
        line = "a hissing noise.";
        if (bVar4) {
          line = "angry snakes!";
        }
        You_hear(line);
      }
      else {
        pline("The iron bars are dissolved!");
      }
      dissolve_bars(barsx,barsy);
      if ((your_fault != '\0') && (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) {
        sokoban_trickster();
      }
    }
  }
  return;
}

Assistant:

void hit_bars(struct obj **obj_p, int objx, int objy, int barsx, int barsy,
	      boolean your_fault, boolean from_invent)
{
	struct obj *otmp = *obj_p;
	int obj_type = otmp->otyp;

	if (your_fault ? hero_breaks(otmp, objx, objy, from_invent) :
			 breaks(otmp, objx, objy)) {
	    *obj_p = NULL;		/* object is now gone */
	    /* breakage makes its own noises */
	    if (obj_type == POT_ACID) {
		if (cansee(barsx, barsy)) {
		    pline("The iron bars are dissolved!");
		} else {
		    You_hear(Hallucination ? "angry snakes!" : "a hissing noise.");
		}
		dissolve_bars(barsx, barsy);
		if (your_fault && In_sokoban(&u.uz))
		    sokoban_trickster();
	    }
	} else if (obj_type == BOULDER || obj_type == HEAVY_IRON_BALL) {
	    pline("Whang!");
	} else if (otmp->oclass == COIN_CLASS ||
		   objects[obj_type].oc_material == GOLD ||
		   objects[obj_type].oc_material == SILVER) {
	    pline("Clink!");
	} else {
	    pline("Clonk!");
	}
}